

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O3

int json_protect_conversion(lua_State *l)

{
  int iVar1;
  int iVar2;
  
  iVar1 = lua_gettop(l);
  if (iVar1 != 1) {
    luaL_argerror(l,1,"expected 1 argument");
  }
  lua_pushvalue(l,-0xf4629);
  iVar2 = 1;
  lua_rotate(l,1,1);
  iVar1 = lua_pcallk(l,1,1,0,0,(lua_KFunction)0x0);
  if (iVar1 != 0) {
    if (iVar1 != 2) {
      iVar1 = luaL_error(l,"Memory allocation error in CJSON protected call");
      return iVar1;
    }
    lua_pushnil(l);
    lua_rotate(l,-2,1);
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

static int json_protect_conversion(lua_State *l)
{
    int err;

    /* Deliberately throw an error for invalid arguments */
    luaL_argcheck(l, lua_gettop(l) == 1, 1, "expected 1 argument");

    /* pcall() the function stored as upvalue(1) */
    lua_pushvalue(l, lua_upvalueindex(1));
    lua_insert(l, 1);
    err = lua_pcall(l, 1, 1, 0);
    if (!err)
        return 1;

    if (err == LUA_ERRRUN) {
        lua_pushnil(l);
        lua_insert(l, -2);
        return 2;
    }

    /* Since we are not using a custom error handler, the only remaining
     * errors are memory related */
    return luaL_error(l, "Memory allocation error in CJSON protected call");
}